

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O2

bool __thiscall
cppcms::impl::file_server::check_in_document_root(file_server *this,string *normal,string *real)

{
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  uint uVar4;
  file_server *this_00;
  string root;
  
  normalize_path(normal);
  this_00 = (file_server *)&root;
  std::__cxx11::string::string((string *)this_00,(string *)&this->document_root_);
  ppVar1 = (this->alias_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->alias_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar4 = 0;
  do {
    if ((ulong)((long)ppVar2 - (long)ppVar1 >> 6) <= (ulong)uVar4) goto LAB_0021b096;
    this_00 = (file_server *)(ppVar1 + uVar4);
    bVar3 = is_file_prefix((string *)this_00,normal);
    uVar4 = uVar4 + 1;
  } while (!bVar3);
  std::__cxx11::string::_M_assign((string *)&root);
  std::__cxx11::string::substr((ulong)&stack0xffffffffffffffb0,(ulong)normal);
  this_00 = (file_server *)&stack0xffffffffffffffb0;
  std::__cxx11::string::operator=((string *)normal,(string *)this_00);
  std::__cxx11::string::~string((string *)this_00);
  if (normal->_M_string_length == 0) {
    this_00 = (file_server *)normal;
    std::__cxx11::string::assign((char *)normal);
  }
LAB_0021b096:
  if ((normal->_M_string_length == 0) || (*(normal->_M_dataplus)._M_p != '/')) {
LAB_0021b0c4:
    bVar3 = false;
  }
  else {
    if (this->check_symlinks_ == true) {
      bVar3 = is_in_root(this_00,normal,&root,real);
      if (!bVar3) goto LAB_0021b0c4;
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &stack0xffffffffffffffb0,&root,normal);
      std::__cxx11::string::operator=((string *)real,(string *)&stack0xffffffffffffffb0);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffb0);
      if ((real->_M_string_length != 0) &&
         ((real->_M_dataplus)._M_p[real->_M_string_length - 1] == '/')) {
        std::__cxx11::string::resize((ulong)real);
      }
    }
    bVar3 = true;
  }
  std::__cxx11::string::~string((string *)&root);
  return bVar3;
}

Assistant:

bool file_server::check_in_document_root(std::string normal,std::string &real) 
{
	normalize_path(normal);
	std::string root = document_root_;
	for(unsigned i=0;i<alias_.size();i++) {
		std::string const &ref=alias_[i].first;
		if(is_file_prefix(ref,normal))
		{
			root = alias_[i].second;
			normal = normal.substr(ref.size());
			if(normal.empty())
				normal="/";
			break;
		}
	}
	if(normal.empty())
		return false;
	if(normal[0]!='/')
		return false;
	if(check_symlinks_) {
		if(!is_in_root(normal,root,real))
			return false;
	}
	else {
		real = root + normal;
        // remove trailing '/' from file name
        size_t real_size = real.size();
        if(real_size > 0 && is_directory_separator(real[real_size-1])) {
            real.resize(real_size-1);
        }
	}
	return true;
}